

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# htable.c
# Opt level: O0

_Bool htable_add(htable *ht,size_t hash,void *p)

{
  _Bool _Var1;
  void *p_local;
  size_t hash_local;
  htable *ht_local;
  
  if ((ht->max < ht->elems + 1) && (_Var1 = double_table(ht), !_Var1)) {
    return false;
  }
  if (ht->max_with_deleted < ht->elems + 1 + ht->deleted) {
    rehash_table(ht);
  }
  if (p != (void *)0x0) {
    if (((ulong)p & ht->common_mask) != ht->common_bits) {
      update_common(ht,p);
    }
    ht_add(ht,p,hash);
    ht->elems = ht->elems + 1;
    return true;
  }
  __assert_fail("p",
                "/workspace/llm4binary/github/license_c_cmakelists/stricaud[P]faup/src/lib/hash/htable.c"
                ,0x109,"_Bool htable_add(struct htable *, size_t, const void *)");
}

Assistant:

bool htable_add(struct htable *ht, size_t hash, const void *p)
{
	if (ht->elems+1 > ht->max && !double_table(ht))
		return false;
	if (ht->elems+1 + ht->deleted > ht->max_with_deleted)
		rehash_table(ht);
	assert(p);
	if (((uintptr_t)p & ht->common_mask) != ht->common_bits)
		update_common(ht, p);

	ht_add(ht, p, hash);
	ht->elems++;
	return true;
}